

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManEquivImprove(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  int local_38;
  int iMffcCur;
  int iMffcBest;
  int iLevelCur;
  int iLevelBest;
  int iReprBest;
  int iRepr;
  int iNode;
  int k;
  int i;
  Vec_Int_t *vClass;
  Gia_Man_t *p_local;
  
  if ((p->pReprs == (Gia_Rpr_t *)0x0) || (p->pNexts == (int *)0x0)) {
    __assert_fail("p->pReprs != NULL && p->pNexts != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x6bc,"void Gia_ManEquivImprove(Gia_Man_t *)");
  }
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  p_00 = Vec_IntAlloc(100);
  iNode = 1;
  do {
    iVar1 = Gia_ManObjNum(p);
    if (iVar1 <= iNode) {
      Vec_IntFree(p_00);
      if (p->pNexts != (int *)0x0) {
        free(p->pNexts);
        p->pNexts = (int *)0x0;
      }
      return;
    }
    iVar1 = Gia_ObjIsHead(p,iNode);
    if (iVar1 != 0) {
      Vec_IntClear(p_00);
      iLevelCur = -1;
      local_38 = 1000000000;
      iMffcBest = 1000000000;
      iVar1 = Gia_ObjIsHead(p,iNode);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsHead(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                      ,0x6c6,"void Gia_ManEquivImprove(Gia_Man_t *)");
      }
      for (iRepr = iNode; 0 < iRepr; iRepr = Gia_ObjNext(p,iRepr)) {
        pGVar3 = Gia_ManObj(p,iRepr);
        iVar1 = Gia_ObjLevel(p,pGVar3);
        pGVar3 = Gia_ManObj(p,iRepr);
        iVar2 = Gia_NodeMffcSize(p,pGVar3);
        if ((iVar1 < iMffcBest) || ((iMffcBest == iVar1 && (iVar2 < local_38)))) {
          iLevelCur = iRepr;
          local_38 = iVar2;
          iMffcBest = iVar1;
        }
        Vec_IntPush(p_00,iRepr);
      }
      iVar1 = Vec_IntSize(p_00);
      if (iVar1 < 2) {
        __assert_fail("Vec_IntSize( vClass ) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                      ,0x6d2,"void Gia_ManEquivImprove(Gia_Man_t *)");
      }
      if (iLevelCur < 1) {
        __assert_fail("iReprBest > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                      ,0x6d3,"void Gia_ManEquivImprove(Gia_Man_t *)");
      }
      if (iNode != iLevelCur) {
        Gia_ObjSetRepr(p,iLevelCur,0xfffffff);
        Gia_ObjSetProved(p,iNode);
        Gia_ObjUnsetProved(p,iLevelCur);
        for (iRepr = 0; iVar1 = Vec_IntSize(p_00), iRepr < iVar1; iRepr = iRepr + 1) {
          iVar1 = Vec_IntEntry(p_00,iRepr);
          if (iVar1 != iLevelCur) {
            Gia_ObjSetRepr(p,iVar1,iLevelCur);
          }
        }
      }
    }
    iNode = iNode + 1;
  } while( true );
}

Assistant:

void Gia_ManEquivImprove( Gia_Man_t * p )
{
    Vec_Int_t * vClass;
    int i, k, iNode, iRepr;
    int iReprBest, iLevelBest, iLevelCur, iMffcBest, iMffcCur;
    assert( p->pReprs != NULL && p->pNexts != NULL );
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    // iterate over class candidates
    vClass = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( p, i )
    {
        Vec_IntClear( vClass );
        iReprBest = -1;
        iLevelBest = iMffcBest = ABC_INFINITY;
        Gia_ClassForEachObj( p, i, k )
        {
            iLevelCur = Gia_ObjLevel( p,Gia_ManObj(p, k) );
            iMffcCur  = Gia_NodeMffcSize( p, Gia_ManObj(p, k) );
            if ( iLevelBest > iLevelCur || (iLevelBest == iLevelCur && iMffcBest > iMffcCur) )
            {
                iReprBest  = k;
                iLevelBest = iLevelCur;
                iMffcBest  = iMffcCur;
            }
            Vec_IntPush( vClass, k );
        }
        assert( Vec_IntSize( vClass ) > 1 );
        assert( iReprBest > 0 );
        if ( i == iReprBest )
            continue;
/*
        Abc_Print( 1, "Repr/Best = %6d/%6d. Lev = %3d/%3d. Mffc = %3d/%3d.\n", 
            i, iReprBest, Gia_ObjLevel( p,Gia_ManObj(p, i) ), Gia_ObjLevel( p,Gia_ManObj(p, iReprBest) ),
            Gia_NodeMffcSize( p, Gia_ManObj(p, i) ), Gia_NodeMffcSize( p, Gia_ManObj(p, iReprBest) ) );
*/
        iRepr = iReprBest;
        Gia_ObjSetRepr( p, iRepr, GIA_VOID );
        Gia_ObjSetProved( p, i );
        Gia_ObjUnsetProved( p, iRepr );
        Vec_IntForEachEntry( vClass, iNode, k )
            if ( iNode != iRepr )
                Gia_ObjSetRepr( p, iNode, iRepr );
    }
    Vec_IntFree( vClass );
    ABC_FREE( p->pNexts );
//    p->pNexts = Gia_ManDeriveNexts( p );
}